

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseInterpolationExpr(Parser *this)

{
  pointer pcVar1;
  undefined8 *puVar2;
  CompileContext *pCVar3;
  size_type *psVar4;
  CompileContext *pCVar5;
  Parser *in_RSI;
  size_type __dnew;
  undefined1 local_a0 [16];
  undefined1 local_90 [32];
  undefined1 local_70 [16];
  char *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  pointer local_38;
  
  local_70._8_4_ = (in_RSI->m_previous).type;
  local_60 = local_58._M_local_buf + 8;
  pcVar1 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (in_RSI->m_previous).lexeme._M_string_length);
  aStack_48._12_2_ = (in_RSI->m_previous).col;
  aStack_48._8_4_ = (in_RSI->m_previous).line;
  puVar2 = (undefined8 *)operator_new(0x28);
  pcVar1 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  local_a0._0_8_ = (CompileContext *)local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,pcVar1,pcVar1 + (in_RSI->m_previous).lexeme._M_string_length);
  *puVar2 = &PTR__StringExpr_00127768;
  puVar2[1] = puVar2 + 3;
  if ((CompileContext *)local_a0._0_8_ == (CompileContext *)local_90) {
    puVar2[3] = local_90._0_8_;
    puVar2[4] = local_90._8_8_;
  }
  else {
    puVar2[1] = local_a0._0_8_;
    puVar2[3] = local_90._0_8_;
  }
  puVar2[2] = local_a0._8_8_;
  parseExpr((Parser *)local_70);
  if ((in_RSI->m_current).type == INTERPOLATION) {
    advance(in_RSI);
    parseInterpolationExpr((Parser *)local_a0);
    pCVar3 = (CompileContext *)local_a0._0_8_;
  }
  else {
    local_38 = (pointer)0x24;
    local_a0._0_8_ = (CompileContext *)local_90;
    local_a0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_a0,(ulong)&local_38);
    local_90._0_8_ = local_38;
    (((CompileContext *)local_a0._0_8_)->m_source).field_2._M_allocated_capacity =
         0x6920676e69727473;
    builtin_strncpy((char *)((long)&(((CompileContext *)local_a0._0_8_)->m_source).field_2 + 8),
                    "nterpola",8);
    (((CompileContext *)local_a0._0_8_)->m_source)._M_dataplus._M_p = (pointer)0x6465746365707845;
    (((CompileContext *)local_a0._0_8_)->m_source)._M_string_length = 0x20666f20646e6520;
    *(undefined4 *)&(((CompileContext *)local_a0._0_8_)->m_options).m_filename._M_dataplus._M_p =
         0x6e6f6974;
    local_a0._8_8_ = local_38;
    local_38[(long)&((CompileContext *)local_a0._0_8_)->m_source] = '\0';
    expect(in_RSI,STRING,(string *)local_a0);
    if ((CompileContext *)local_a0._0_8_ != (CompileContext *)local_90) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
    }
    pCVar3 = (CompileContext *)operator_new(0x28);
    pcVar1 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
    local_a0._0_8_ = (CompileContext *)local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,pcVar1,pcVar1 + (in_RSI->m_previous).lexeme._M_string_length);
    (pCVar3->m_source)._M_dataplus._M_p = (pointer)&PTR__StringExpr_00127768;
    psVar4 = (size_type *)((long)&(pCVar3->m_source).field_2 + 8);
    (pCVar3->m_source)._M_string_length = (size_type)psVar4;
    if ((CompileContext *)local_a0._0_8_ == (CompileContext *)local_90) {
      *psVar4 = local_90._0_8_;
      (pCVar3->m_options).m_filename._M_dataplus._M_p = (pointer)local_90._8_8_;
    }
    else {
      (pCVar3->m_source)._M_string_length = local_a0._0_8_;
      *(undefined8 *)((long)&(pCVar3->m_source).field_2 + 8) = local_90._0_8_;
    }
    (pCVar3->m_source).field_2._M_allocated_capacity = local_a0._8_8_;
  }
  pCVar5 = (CompileContext *)operator_new(0x50);
  if (local_60 == local_58._M_local_buf + 8) {
    local_90._16_8_ = aStack_48._M_allocated_capacity;
    local_60 = local_90 + 8;
  }
  (pCVar5->m_source)._M_dataplus._M_p = (pointer)&PTR__InterpolationExpr_00127840;
  (pCVar5->m_source)._M_string_length = (size_type)puVar2;
  (pCVar5->m_source).field_2._M_allocated_capacity = local_70._0_8_;
  *(CompileContext **)((long)&(pCVar5->m_source).field_2 + 8) = pCVar3;
  *(undefined4 *)&(pCVar5->m_options).m_filename._M_dataplus._M_p = local_70._8_4_;
  puVar2 = (undefined8 *)((long)&(pCVar5->m_options).m_filename.field_2 + 8);
  (pCVar5->m_options).m_filename._M_string_length = (size_type)puVar2;
  if (local_60 == local_90 + 8) {
    *puVar2 = local_58._8_8_;
    (pCVar5->m_options).m_programArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_90._16_8_;
  }
  else {
    (pCVar5->m_options).m_filename._M_string_length = (size_type)local_60;
    *(undefined8 *)((long)&(pCVar5->m_options).m_filename.field_2 + 8) = local_58._8_8_;
  }
  (pCVar5->m_options).m_filename.field_2._M_allocated_capacity = local_58._M_allocated_capacity;
  *(undefined4 *)
   &(pCVar5->m_options).m_programArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = aStack_48._8_4_;
  *(undefined2 *)
   ((long)&(pCVar5->m_options).m_programArgs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = aStack_48._12_2_;
  this->m_context = pCVar5;
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseInterpolationExpr() {
        Token token = m_previous;
        std::unique_ptr<StringExpr> start = std::make_unique<StringExpr>(m_previous.lexeme);
        std::unique_ptr<Expr> interpolated = parseExpr();
        std::unique_ptr<Expr> end;

        if (consume(TokenType::INTERPOLATION)) {
            end = parseInterpolationExpr();
        } else {
            expect(TokenType::STRING, "Expected end of string interpolation");
            end = std::make_unique<StringExpr>(m_previous.lexeme);
        }

        return std::make_unique<InterpolationExpr>(
                std::move(start),
                std::move(interpolated),
                std::move(end),
                std::move(token));
    }